

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doGetUsedFuncs(DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *this,FuncSet *dst)

{
  long *plVar1;
  Expr<tcu::Vector<float,_3>_> *pEVar2;
  pointer pSVar3;
  ulong uVar4;
  long lVar5;
  pair<std::_Rb_tree_iterator<const_vkt::shaderexecutor::FuncBase_*>,_bool> pVar6;
  DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *local_28;
  
  initialize(this);
  local_28 = this;
  pVar6 = std::
          _Rb_tree<vkt::shaderexecutor::FuncBase_const*,vkt::shaderexecutor::FuncBase_const*,std::_Identity<vkt::shaderexecutor::FuncBase_const*>,std::less<vkt::shaderexecutor::FuncBase_const*>,std::allocator<vkt::shaderexecutor::FuncBase_const*>>
          ::_M_insert_unique<vkt::shaderexecutor::FuncBase_const*>
                    ((_Rb_tree<vkt::shaderexecutor::FuncBase_const*,vkt::shaderexecutor::FuncBase_const*,std::_Identity<vkt::shaderexecutor::FuncBase_const*>,std::less<vkt::shaderexecutor::FuncBase_const*>,std::allocator<vkt::shaderexecutor::FuncBase_const*>>
                      *)dst,(FuncBase **)&local_28);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pSVar3 = (this->m_body).
             super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_body).
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != pSVar3) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        plVar1 = *(long **)((long)&(pSVar3->super_SharedPtr<const_vkt::shaderexecutor::Statement>).
                                   m_ptr + lVar5);
        (**(code **)(*plVar1 + 0x20))(plVar1,dst);
        uVar4 = uVar4 + 1;
        pSVar3 = (this->m_body).
                 super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x10;
      } while (uVar4 < (ulong)((long)(this->m_body).
                                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 4)
              );
    }
    pEVar2 = (this->m_ret).super_ContainerExprPBase<tcu::Vector<float,_3>_>.
             super_ExprPBase<tcu::Vector<float,_3>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>.m_ptr;
    (*(pEVar2->super_ExprBase)._vptr_ExprBase[3])(pEVar2,dst);
  }
  return;
}

Assistant:

void						doGetUsedFuncs	(FuncSet& dst) const
	{
		initialize();
		if (dst.insert(this).second)
		{
			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->getUsedFuncs(dst);
			m_ret->getUsedFuncs(dst);
		}
	}